

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

void instantiate_hoisted_definitions(JSContext *ctx,JSFunctionDef *s,DynBuf *bc)

{
  JSClosureVar *pJVar1;
  byte bVar2;
  JSGlobalVar *pJVar3;
  JSFunctionDef *in_RDX;
  JSFunctionDef *in_RSI;
  int flags;
  JSClosureVar *cv;
  BOOL force_init;
  int has_closure;
  JSGlobalVar *hf;
  JSVarDef *vd_1;
  JSVarDef *vd;
  int label_next;
  int idx;
  int i;
  undefined4 in_stack_ffffffffffffff78;
  undefined2 in_stack_ffffffffffffff7c;
  undefined1 in_stack_ffffffffffffff7e;
  uint8_t in_stack_ffffffffffffff7f;
  JSFunctionDef *in_stack_ffffffffffffff80;
  JSFunctionDef *in_stack_ffffffffffffff88;
  JSFunctionDef *in_stack_ffffffffffffff90;
  int local_44;
  int local_24;
  int local_20;
  int local_1c;
  
  local_24 = -1;
  for (local_1c = 0; local_1c < in_RSI->arg_count; local_1c = local_1c + 1) {
    if (-1 < (*(int *)&in_RSI->args[local_1c].field_0xc << 1) >> 8) {
      dbuf_putc((DynBuf *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7f);
      dbuf_put_u32((DynBuf *)in_stack_ffffffffffffff80,
                   CONCAT13(in_stack_ffffffffffffff7f,
                            CONCAT12(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff7c)));
      dbuf_putc((DynBuf *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7f);
      dbuf_put_u16((DynBuf *)in_stack_ffffffffffffff80,
                   CONCAT11(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff7e));
    }
  }
  for (local_1c = 0; local_1c < in_RSI->var_count; local_1c = local_1c + 1) {
    if ((in_RSI->vars[local_1c].scope_level == 0) &&
       (-1 < (*(int *)&in_RSI->vars[local_1c].field_0xc << 1) >> 8)) {
      dbuf_putc((DynBuf *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7f);
      dbuf_put_u32((DynBuf *)in_stack_ffffffffffffff80,
                   CONCAT13(in_stack_ffffffffffffff7f,
                            CONCAT12(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff7c)));
      dbuf_putc((DynBuf *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7f);
      dbuf_put_u16((DynBuf *)in_stack_ffffffffffffff80,
                   CONCAT11(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff7e));
    }
  }
  if (in_RSI->module != (JSModuleDef *)0x0) {
    local_24 = new_label_fd(in_stack_ffffffffffffff88,
                            (int)((ulong)in_stack_ffffffffffffff80 >> 0x20));
    dbuf_putc((DynBuf *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7f);
    dbuf_putc((DynBuf *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7f);
    dbuf_put_u32((DynBuf *)in_stack_ffffffffffffff80,
                 CONCAT13(in_stack_ffffffffffffff7f,
                          CONCAT12(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff7c)));
    update_label(in_RSI,local_24,1);
    in_RSI->jump_size = in_RSI->jump_size + 1;
  }
  local_1c = 0;
  do {
    if (in_RSI->global_var_count <= local_1c) {
      if (in_RSI->module != (JSModuleDef *)0x0) {
        dbuf_putc((DynBuf *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7f);
        dbuf_putc((DynBuf *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7f);
        dbuf_put_u32((DynBuf *)in_stack_ffffffffffffff80,
                     CONCAT13(in_stack_ffffffffffffff7f,
                              CONCAT12(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff7c)));
        in_RSI->label_slots[local_24].pos2 = (int)((list_head *)&in_RDX->parent)->prev;
      }
      js_free((JSContext *)in_stack_ffffffffffffff80,
              (void *)CONCAT17(in_stack_ffffffffffffff7f,
                               CONCAT16(in_stack_ffffffffffffff7e,
                                        CONCAT24(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78
                                                ))));
      in_RSI->global_vars = (JSGlobalVar *)0x0;
      in_RSI->global_var_count = 0;
      in_RSI->global_var_size = 0;
      return;
    }
    pJVar3 = in_RSI->global_vars + local_1c;
    local_44 = 0;
    bVar2 = pJVar3->field_0x4 & 1;
    for (local_20 = 0; local_20 < in_RSI->closure_var_count; local_20 = local_20 + 1) {
      pJVar1 = in_RSI->closure_var;
      if (pJVar1[local_20].var_name == pJVar3->var_name) {
        local_44 = 2;
        bVar2 = 0;
        break;
      }
      if ((pJVar1[local_20].var_name == 0x52) || (pJVar1[local_20].var_name == 0x53)) {
        dbuf_putc((DynBuf *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7f);
        dbuf_put_u16((DynBuf *)in_stack_ffffffffffffff80,
                     CONCAT11(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff7e));
        local_44 = 1;
        bVar2 = 1;
        break;
      }
    }
    if (local_44 == 0) {
      if ((pJVar3->cpool_idx < 0) || (((byte)pJVar3->field_0x4 >> 1 & 1) != 0)) {
        dbuf_putc((DynBuf *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7f);
        JS_DupAtom((JSContext *)in_stack_ffffffffffffff90,
                   (JSAtom)((ulong)in_stack_ffffffffffffff88 >> 0x20));
        dbuf_put_u32((DynBuf *)in_stack_ffffffffffffff80,
                     CONCAT13(in_stack_ffffffffffffff7f,
                              CONCAT12(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff7c)));
        dbuf_putc((DynBuf *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7f);
        goto LAB_001a7183;
      }
      dbuf_putc((DynBuf *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7f);
      dbuf_put_u32((DynBuf *)in_stack_ffffffffffffff80,
                   CONCAT13(in_stack_ffffffffffffff7f,
                            CONCAT12(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff7c)));
      dbuf_putc((DynBuf *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7f);
      JS_DupAtom((JSContext *)in_stack_ffffffffffffff90,
                 (JSAtom)((ulong)in_stack_ffffffffffffff88 >> 0x20));
      dbuf_put_u32((DynBuf *)in_stack_ffffffffffffff80,
                   CONCAT13(in_stack_ffffffffffffff7f,
                            CONCAT12(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff7c)));
      dbuf_putc((DynBuf *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7f);
    }
    else {
LAB_001a7183:
      if ((-1 < pJVar3->cpool_idx) || (bVar2 != 0)) {
        if (pJVar3->cpool_idx < 0) {
          dbuf_putc((DynBuf *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7f);
        }
        else {
          dbuf_putc((DynBuf *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7f);
          dbuf_put_u32((DynBuf *)in_stack_ffffffffffffff80,
                       CONCAT13(in_stack_ffffffffffffff7f,
                                CONCAT12(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff7c)));
          if (pJVar3->var_name == 0x7c) {
            dbuf_putc((DynBuf *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7f);
            in_stack_ffffffffffffff90 = in_RDX;
            JS_DupAtom((JSContext *)in_RDX,(JSAtom)((ulong)in_stack_ffffffffffffff88 >> 0x20));
            dbuf_put_u32((DynBuf *)in_stack_ffffffffffffff80,
                         CONCAT13(in_stack_ffffffffffffff7f,
                                  CONCAT12(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff7c)));
          }
        }
        if (local_44 == 2) {
          dbuf_putc((DynBuf *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7f);
          dbuf_put_u16((DynBuf *)in_stack_ffffffffffffff80,
                       CONCAT11(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff7e));
        }
        else if (local_44 == 1) {
          dbuf_putc((DynBuf *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7f);
          in_stack_ffffffffffffff88 = in_RDX;
          JS_DupAtom((JSContext *)in_stack_ffffffffffffff90,(JSAtom)((ulong)in_RDX >> 0x20));
          dbuf_put_u32((DynBuf *)in_stack_ffffffffffffff80,
                       CONCAT13(in_stack_ffffffffffffff7f,
                                CONCAT12(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff7c)));
          dbuf_putc((DynBuf *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7f);
        }
        else {
          dbuf_putc((DynBuf *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7f);
          in_stack_ffffffffffffff80 = in_RDX;
          JS_DupAtom((JSContext *)in_stack_ffffffffffffff90,
                     (JSAtom)((ulong)in_stack_ffffffffffffff88 >> 0x20));
          dbuf_put_u32((DynBuf *)in_stack_ffffffffffffff80,
                       CONCAT13(in_stack_ffffffffffffff7f,
                                CONCAT12(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff7c)));
        }
      }
    }
    JS_FreeAtom((JSContext *)in_stack_ffffffffffffff80,
                CONCAT13(in_stack_ffffffffffffff7f,
                         CONCAT12(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff7c)));
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

static void instantiate_hoisted_definitions(JSContext *ctx, JSFunctionDef *s, DynBuf *bc)
{
    int i, idx, label_next = -1;

    /* add the hoisted functions in arguments and local variables */
    for(i = 0; i < s->arg_count; i++) {
        JSVarDef *vd = &s->args[i];
        if (vd->func_pool_idx >= 0) {
            dbuf_putc(bc, OP_fclosure);
            dbuf_put_u32(bc, vd->func_pool_idx);
            dbuf_putc(bc, OP_put_arg);
            dbuf_put_u16(bc, i);
        }
    }
    for(i = 0; i < s->var_count; i++) {
        JSVarDef *vd = &s->vars[i];
        if (vd->scope_level == 0 && vd->func_pool_idx >= 0) {
            dbuf_putc(bc, OP_fclosure);
            dbuf_put_u32(bc, vd->func_pool_idx);
            dbuf_putc(bc, OP_put_loc);
            dbuf_put_u16(bc, i);
        }
    }

    /* the module global variables must be initialized before
       evaluating the module so that the exported functions are
       visible if there are cyclic module references */
    if (s->module) {
        label_next = new_label_fd(s, -1);
        
        /* if 'this' is true, initialize the global variables and return */
        dbuf_putc(bc, OP_push_this);
        dbuf_putc(bc, OP_if_false);
        dbuf_put_u32(bc, label_next);
        update_label(s, label_next, 1);
        s->jump_size++;
    }
    
    /* add the global variables (only happens if s->is_global_var is
       true) */
    for(i = 0; i < s->global_var_count; i++) {
        JSGlobalVar *hf = &s->global_vars[i];
        int has_closure = 0;
        BOOL force_init = hf->force_init;
        /* we are in an eval, so the closure contains all the
           enclosing variables */
        /* If the outer function has a variable environment,
           create a property for the variable there */
        for(idx = 0; idx < s->closure_var_count; idx++) {
            JSClosureVar *cv = &s->closure_var[idx];
            if (cv->var_name == hf->var_name) {
                has_closure = 2;
                force_init = FALSE;
                break;
            }
            if (cv->var_name == JS_ATOM__var_ ||
                cv->var_name == JS_ATOM__arg_var_) {
                dbuf_putc(bc, OP_get_var_ref);
                dbuf_put_u16(bc, idx);
                has_closure = 1;
                force_init = TRUE;
                break;
            }
        }
        if (!has_closure) {
            int flags;
            
            flags = 0;
            if (s->eval_type != JS_EVAL_TYPE_GLOBAL)
                flags |= JS_PROP_CONFIGURABLE;
            if (hf->cpool_idx >= 0 && !hf->is_lexical) {
                /* global function definitions need a specific handling */
                dbuf_putc(bc, OP_fclosure);
                dbuf_put_u32(bc, hf->cpool_idx);
                
                dbuf_putc(bc, OP_define_func);
                dbuf_put_u32(bc, JS_DupAtom(ctx, hf->var_name));
                dbuf_putc(bc, flags);
                
                goto done_global_var;
            } else {
                if (hf->is_lexical) {
                    flags |= DEFINE_GLOBAL_LEX_VAR;
                    if (!hf->is_const)
                        flags |= JS_PROP_WRITABLE;
                }
                dbuf_putc(bc, OP_define_var);
                dbuf_put_u32(bc, JS_DupAtom(ctx, hf->var_name));
                dbuf_putc(bc, flags);
            }
        }
        if (hf->cpool_idx >= 0 || force_init) {
            if (hf->cpool_idx >= 0) {
                dbuf_putc(bc, OP_fclosure);
                dbuf_put_u32(bc, hf->cpool_idx);
                if (hf->var_name == JS_ATOM__default_) {
                    /* set default export function name */
                    dbuf_putc(bc, OP_set_name);
                    dbuf_put_u32(bc, JS_DupAtom(ctx, JS_ATOM_default));
                }
            } else {
                dbuf_putc(bc, OP_undefined);
            }
            if (has_closure == 2) {
                dbuf_putc(bc, OP_put_var_ref);
                dbuf_put_u16(bc, idx);
            } else if (has_closure == 1) {
                dbuf_putc(bc, OP_define_field);
                dbuf_put_u32(bc, JS_DupAtom(ctx, hf->var_name));
                dbuf_putc(bc, OP_drop);
            } else {
                /* XXX: Check if variable is writable and enumerable */
                dbuf_putc(bc, OP_put_var);
                dbuf_put_u32(bc, JS_DupAtom(ctx, hf->var_name));
            }
        }
    done_global_var:
        JS_FreeAtom(ctx, hf->var_name);
    }

    if (s->module) {
        dbuf_putc(bc, OP_return_undef);
        
        dbuf_putc(bc, OP_label);
        dbuf_put_u32(bc, label_next);
        s->label_slots[label_next].pos2 = bc->size;
    }

    js_free(ctx, s->global_vars);
    s->global_vars = NULL;
    s->global_var_count = 0;
    s->global_var_size = 0;
}